

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

float rsg::BinaryOp<7,_(rsg::Associativity)0>::getWeight
                (GeneratorState *state,ConstValueRangeAccess valueRange)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ShaderParameters *pSVar4;
  VariableType *this;
  float local_48;
  int availableLevels;
  GeneratorState *state_local;
  
  iVar2 = GeneratorState::getPrecedence(state);
  if (iVar2 < 7) {
    state_local._4_4_ = 0.0;
  }
  else {
    pSVar4 = GeneratorState::getShaderParameters(state);
    iVar2 = pSVar4->maxExpressionDepth;
    iVar3 = GeneratorState::getExpressionDepth(state);
    iVar2 = iVar2 - iVar3;
    this = ConstValueRangeAccess::getType(&valueRange);
    bVar1 = VariableType::isVoid(this);
    if (bVar1) {
      local_48 = 0.05;
      if (iVar2 < 2) {
        local_48 = 0.0;
      }
      state_local._4_4_ = local_48;
    }
    else {
      iVar3 = getConservativeValueExprDepth(state,valueRange);
      if (iVar2 < iVar3 + 1) {
        state_local._4_4_ = 0.0;
      }
      else {
        state_local._4_4_ = 1.0;
      }
    }
  }
  return state_local._4_4_;
}

Assistant:

float BinaryOp<Precedence, Assoc>::getWeight (const GeneratorState& state, ConstValueRangeAccess valueRange)
{
	if (state.getPrecedence() < Precedence)
		return 0.0f;

	int availableLevels = state.getShaderParameters().maxExpressionDepth - state.getExpressionDepth();

	if (valueRange.getType().isVoid())
		return availableLevels >= 2 ? unusedValueWeight : 0.0f;

	if (availableLevels < getConservativeValueExprDepth(state, valueRange) + 1)
		return 0.0f;

	return 1.0f;
}